

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteStates::SoftPrint_abi_cxx11_(MADPComponentDiscreteStates *this)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_t sVar3;
  void *this_00;
  MADPComponentDiscreteStates *in_RSI;
  string *in_RDI;
  stringstream ss2;
  stringstream ss;
  stringstream *in_stack_fffffffffffffc38;
  E *in_stack_fffffffffffffc40;
  string local_370 [32];
  string local_350 [48];
  stringstream local_320 [16];
  ostream local_310 [264];
  MADPComponentDiscreteStates *in_stack_fffffffffffffdf8;
  MADPComponentDiscreteStates *in_stack_fffffffffffffe28;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if ((in_RSI->_m_initialized & 1U) == 0) {
    std::__cxx11::stringstream::stringstream(local_320);
    poVar1 = std::operator<<(local_310,"MADPComponentDiscreteStates::SoftPrint(");
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  poVar1 = std::operator<<(local_188,"- nr. states=");
  sVar3 = GetNrStates(in_RSI);
  this_00 = (void *)std::ostream::operator<<(poVar1,sVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = local_188;
  SoftPrintStates_abi_cxx11_(in_stack_fffffffffffffe28);
  std::operator<<(poVar1,local_350);
  std::__cxx11::string::~string(local_350);
  std::operator<<(local_188,"Initial state distr.: ");
  poVar1 = local_188;
  SoftPrintInitialStateDistribution_abi_cxx11_(in_stack_fffffffffffffdf8);
  std::operator<<(poVar1,local_370);
  std::__cxx11::string::~string(local_370);
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteStates::SoftPrint() const
{
    stringstream ss;
    if(!_m_initialized)
    {
        stringstream ss2;
        ss2 << "MADPComponentDiscreteStates::SoftPrint("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss2);
    }
    ss << "- nr. states="<< GetNrStates()<<endl;
    ss << SoftPrintStates();
    ss << "Initial state distr.: ";
    ss << SoftPrintInitialStateDistribution();
    ss << endl;
    return(ss.str());
}